

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

char * alloc_string(char *in)

{
  size_t insize;
  char *pcVar1;
  
  insize = lodepng_strlen(in);
  pcVar1 = alloc_string_sized(in,insize);
  return pcVar1;
}

Assistant:

static char* alloc_string(const char* in) {
  return alloc_string_sized(in, lodepng_strlen(in));
}